

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O3

void Omega_h::anon_unknown_41::promote_bools(LO size,any *lhs,any *rhs)

{
  int *piVar1;
  char *pcVar2;
  ulong *puVar3;
  char *__s2;
  bool bVar4;
  int iVar5;
  type_info *ptVar6;
  undefined8 *puVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  Alloc *pAVar8;
  
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar6 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar6 = (*lhs->vtable->type)();
  }
  __s2 = _ofstream;
  pcVar2 = *(char **)(ptVar6 + 8);
  if ((pcVar2 == _ofstream) || ((*pcVar2 != '*' && (iVar5 = strcmp(pcVar2,_ofstream), iVar5 == 0))))
  {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar6 = (*rhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar6 + 8);
    if ((pcVar2 == "N7Omega_h4ReadIaEE") ||
       ((*pcVar2 != '*' && (iVar5 = strcmp(pcVar2,"N7Omega_h4ReadIaEE"), iVar5 == 0)))) {
      bVar4 = any::is_typed(rhs,(type_info *)&Read<signed_char>::typeinfo);
      if ((!bVar4) || (puVar3 = (ulong *)(rhs->storage).dynamic, puVar3 == (ulong *)0x0))
      goto LAB_002b0dbb;
      pAVar8 = (Alloc *)*puVar3;
      if (((ulong)pAVar8 & 7) == 0 && pAVar8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          pAVar8 = (Alloc *)(pAVar8->size * 8 + 1);
        }
        else {
          pAVar8->use_count = pAVar8->use_count + 1;
        }
      }
      if (((ulong)pAVar8 & 1) == 0) {
        iVar5 = (int)pAVar8->size;
      }
      else {
        iVar5 = (int)((ulong)pAVar8 >> 3);
      }
      if (iVar5 != size) {
        fail("assertion %s failed at %s +%d\n","any_cast<Bytes>(rhs).size() == size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,0x15,in_R8,in_R9,pAVar8,puVar3[1]);
      }
      if (((ulong)pAVar8 & 7) == 0 && pAVar8 != (Alloc *)0x0) {
        piVar1 = &pAVar8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar8);
          operator_delete(pAVar8,0x48);
        }
      }
      promote_bool(size,lhs);
    }
  }
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar6 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar6 = (*lhs->vtable->type)();
  }
  pcVar2 = *(char **)(ptVar6 + 8);
  if (pcVar2 != "N7Omega_h4ReadIaEE") {
    if (*pcVar2 == '*') {
      return;
    }
    iVar5 = strcmp(pcVar2,"N7Omega_h4ReadIaEE");
    if (iVar5 != 0) {
      return;
    }
  }
  if (rhs->vtable == (vtable_type *)0x0) {
    ptVar6 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar6 = (*rhs->vtable->type)();
  }
  pcVar2 = *(char **)(ptVar6 + 8);
  if (pcVar2 != __s2) {
    if (*pcVar2 == '*') {
      return;
    }
    iVar5 = strcmp(pcVar2,__s2);
    if (iVar5 != 0) {
      return;
    }
  }
  bVar4 = any::is_typed(lhs,(type_info *)&Read<signed_char>::typeinfo);
  if ((bVar4) && (puVar3 = (ulong *)(lhs->storage).dynamic, puVar3 != (ulong *)0x0)) {
    pAVar8 = (Alloc *)*puVar3;
    if (((ulong)pAVar8 & 7) == 0 && pAVar8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAVar8 = (Alloc *)(pAVar8->size * 8 + 1);
      }
      else {
        pAVar8->use_count = pAVar8->use_count + 1;
      }
    }
    if (((ulong)pAVar8 & 1) == 0) {
      iVar5 = (int)pAVar8->size;
    }
    else {
      iVar5 = (int)((ulong)pAVar8 >> 3);
    }
    if (iVar5 != size) {
      fail("assertion %s failed at %s +%d\n","any_cast<Bytes>(lhs).size() == size",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
           ,0x19,in_R8,in_R9,pAVar8,puVar3[1]);
    }
    if (((ulong)pAVar8 & 7) == 0 && pAVar8 != (Alloc *)0x0) {
      piVar1 = &pAVar8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar8);
        operator_delete(pAVar8,0x48);
      }
    }
    promote_bool(size,rhs);
    return;
  }
LAB_002b0dbb:
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = &PTR__bad_cast_004b86a8;
  __cxa_throw(puVar7,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

void promote_bools(LO size, any& lhs, any& rhs) {
  if (lhs.type() == typeid(bool) && rhs.type() == typeid(Bytes)) {
    OMEGA_H_CHECK(any_cast<Bytes>(rhs).size() == size);
    promote_bool(size, lhs);
  }
  if (lhs.type() == typeid(Bytes) && rhs.type() == typeid(bool)) {
    OMEGA_H_CHECK(any_cast<Bytes>(lhs).size() == size);
    promote_bool(size, rhs);
  }
}